

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this,Type *sourceType)

{
  Expression *pEVar1;
  bool bVar2;
  CompileMessage local_f0;
  CompileMessage local_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  bVar2 = checkSourceType(this,sourceType);
  if (!bVar2) {
    switch(this->operation) {
    case makeConst:
      CompileMessageHelpers::createMessage<>
                (&local_80,syntax,error,
                 "The \'const\' keyword cannot be applied to a type that is already const");
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_80,false);
    case elementType:
      CompileMessageHelpers::createMessage<>
                (&local_b8,syntax,error,
                 "\'elementType\' can only be applied to an array or vector type");
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_b8,false);
    case primitiveType:
      CompileMessageHelpers::createMessage<>
                (&local_f0,syntax,error,
                 "\'primitiveType\' can only be applied to a vector or primitive type");
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_f0,false);
    case size:
      pEVar1 = (this->source).object;
      CompileMessageHelpers::createMessage<>
                (&local_48,syntax,error,"Cannot take the size of this type");
      Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_48,false);
    }
  }
  return;
}

Assistant:

void throwErrorIfUnresolved (const Type& sourceType) const
        {
            if (! checkSourceType (sourceType))
            {
                if (operation == Op::size)           source->context.throwError (Errors::cannotTakeSizeOfType());
                if (operation == Op::makeConst)      context.throwError (Errors::tooManyConsts());
                if (operation == Op::elementType)    context.throwError (Errors::badTypeForElementType());
                if (operation == Op::primitiveType)  context.throwError (Errors::badTypeForPrimitiveType());
            }
        }